

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

StringMaker<sisl::cartesian_cubic<float>*> * __thiscall
Catch::StringMaker<sisl::cartesian_cubic<float>*>::convert<sisl::cartesian_cubic<float>>
          (StringMaker<sisl::cartesian_cubic<float>*> *this,cartesian_cubic<float> *p)

{
  ostringstream local_1a8 [8];
  ostringstream oss;
  allocator local_19;
  cartesian_cubic<float> *local_18;
  cartesian_cubic<float> *p_local;
  
  local_18 = p;
  p_local = (cartesian_cubic<float> *)this;
  if (p == (cartesian_cubic<float> *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"__null",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::ostream::operator<<(local_1a8,local_18);
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
  }
  return this;
}

Assistant:

static std::string convert( U* p ) {
        if( !p )
            return INTERNAL_CATCH_STRINGIFY( NULL );
        std::ostringstream oss;
        oss << p;
        return oss.str();
    }